

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int decode_encoded_header_info(archive_read *a,_7z_stream_info *si)

{
  void *pvVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  char *fmt;
  
  pvVar1 = a->format->data;
  piVar5 = __errno_location();
  *piVar5 = 0;
  iVar4 = read_StreamsInfo(a,si);
  if (iVar4 < 0) {
    fmt = "Malformed 7-Zip archive";
    if (*piVar5 == 0xc) {
      fmt = "Couldn\'t allocate memory";
    }
  }
  else {
    fmt = "Malformed 7-Zip archive";
    if (((si->pi).numPackStreams != 0) && ((si->ci).numFolders != 0)) {
      uVar2 = (si->pi).pos;
      fmt = "Malformed Header offset";
      if ((-1 < (long)uVar2) &&
         (((uVar3 = *(si->pi).sizes, uVar3 != 0 &&
           (uVar6 = uVar3 + uVar2, uVar6 <= *(ulong *)((long)pvVar1 + 0x80))) && (-1 < (long)uVar6))
         )) {
        return 0;
      }
    }
  }
  archive_set_error(&a->archive,-1,fmt);
  return -0x1e;
}

Assistant:

static int
decode_encoded_header_info(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;

	errno = 0;
	if (read_StreamsInfo(a, si) < 0) {
		if (errno == ENOMEM)
			archive_set_error(&a->archive, -1,
			    "Couldn't allocate memory");
		else
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}

	if (si->pi.numPackStreams == 0 || si->ci.numFolders == 0) {
		archive_set_error(&a->archive, -1, "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}

	if (zip->header_offset < si->pi.pos + si->pi.sizes[0] ||
	    (int64_t)(si->pi.pos + si->pi.sizes[0]) < 0 ||
	    si->pi.sizes[0] == 0 || (int64_t)si->pi.pos < 0) {
		archive_set_error(&a->archive, -1, "Malformed Header offset");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}